

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Cond<tcu::Vector<float,_2>_>::doApply
          (IRet *__return_storage_ptr__,Cond<tcu::Vector<float,_2>_> *this,EvalContext *param_1,
          IArgs *iargs)

{
  double dVar1;
  Interval *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  double dStack_20;
  
  __return_storage_ptr__->m_data[0].m_hasNaN = false;
  __return_storage_ptr__->m_data[0].m_lo = INFINITY;
  __return_storage_ptr__->m_data[0].m_hi = -INFINITY;
  __return_storage_ptr__->m_data[1].m_hasNaN = false;
  __return_storage_ptr__->m_data[1].m_lo = INFINITY;
  __return_storage_ptr__->m_data[1].m_hi = -INFINITY;
  pIVar2 = iargs->a;
  dVar1 = pIVar2->m_lo;
  uVar3 = SUB84(dVar1,0);
  uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
  if ((dVar1 <= 1.0) && (1.0 <= pIVar2->m_hi)) {
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doUnion
              (__return_storage_ptr__,iargs->b);
    __return_storage_ptr__->m_data[1].m_lo = local_28;
    __return_storage_ptr__->m_data[1].m_hi = dStack_20;
    __return_storage_ptr__->m_data[0].m_hi = local_38;
    *(undefined8 *)(__return_storage_ptr__->m_data + 1) = uStack_30;
    *(undefined8 *)__return_storage_ptr__->m_data = local_48;
    __return_storage_ptr__->m_data[0].m_lo = dStack_40;
    pIVar2 = iargs->a;
    uVar3 = SUB84(pIVar2->m_lo,0);
    uVar4 = (undefined4)((ulong)pIVar2->m_lo >> 0x20);
  }
  if (((double)CONCAT44(uVar4,uVar3) <= 0.0) && (0.0 <= pIVar2->m_hi)) {
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doUnion
              (__return_storage_ptr__,iargs->c);
    __return_storage_ptr__->m_data[1].m_lo = local_28;
    __return_storage_ptr__->m_data[1].m_hi = dStack_20;
    __return_storage_ptr__->m_data[0].m_hi = local_38;
    *(undefined8 *)(__return_storage_ptr__->m_data + 1) = uStack_30;
    *(undefined8 *)__return_storage_ptr__->m_data = local_48;
    __return_storage_ptr__->m_data[0].m_lo = dStack_40;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}